

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void Network_Controller(int playernum,bool add)

{
  char *pcVar1;
  DBot *pDVar2;
  long lVar3;
  char *format;
  
  if (consoleplayer != Net_Arbitrator) {
    pcVar1 = "This command is only accessible to the net arbitrator.\n";
LAB_0043fc15:
    Printf(pcVar1);
    return;
  }
  lVar3 = (long)playernum * 0x2a0;
  if (((&DAT_009ba5b1)[lVar3] & add) == 1) {
    pcVar1 = userinfo_t::GetName((userinfo_t *)(&DAT_009ba458 + lVar3));
    format = "%s is already on the setting controller list.\n";
  }
  else {
    if ((&DAT_009ba5b1)[lVar3] != 0 || add) {
      if (playeringame[playernum] == false) {
        Printf("Player (%d) not found!\n",playernum);
        return;
      }
      pDVar2 = GC::ReadBarrier<DBot>((DBot **)(&DAT_009ba5b8 + lVar3));
      if (pDVar2 == (DBot *)0x0) {
        if (Net_Arbitrator != playernum) {
          Net_WriteByte(add ^ 0x31);
          Net_WriteByte((BYTE)playernum);
          return;
        }
        pcVar1 = "The net arbitrator cannot have their status changed on this list.\n";
      }
      else {
        pcVar1 = "Bots cannot be added to the controller list.\n";
      }
      goto LAB_0043fc15;
    }
    pcVar1 = userinfo_t::GetName((userinfo_t *)(&DAT_009ba458 + lVar3));
    format = "%s is not on the setting controller list.\n";
  }
  Printf(format,pcVar1);
  return;
}

Assistant:

static void Network_Controller (int playernum, bool add)
{
	if (consoleplayer != Net_Arbitrator)
	{
		Printf ("This command is only accessible to the net arbitrator.\n");
		return;
	}

	if (players[playernum].settings_controller && add)
	{
		Printf ("%s is already on the setting controller list.\n", players[playernum].userinfo.GetName());
		return;
	}

	if (!players[playernum].settings_controller && !add)
	{
		Printf ("%s is not on the setting controller list.\n", players[playernum].userinfo.GetName());
		return;
	}

	if (!playeringame[playernum])
	{
		Printf ("Player (%d) not found!\n", playernum);
		return;
	}

	if (players[playernum].Bot != NULL)
	{
		Printf ("Bots cannot be added to the controller list.\n");
		return;
	}

	if (playernum == Net_Arbitrator)
	{
		Printf ("The net arbitrator cannot have their status changed on this list.\n");
		return;
	}

	if (add)
		Net_WriteByte (DEM_ADDCONTROLLER);
	else
		Net_WriteByte (DEM_DELCONTROLLER);

	Net_WriteByte (playernum);
}